

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O3

void __thiscall UEFITool::search(UEFITool *this)

{
  FfsFinder *this_00;
  char cVar1;
  byte bVar2;
  bool unicode;
  byte bVar3;
  int iVar4;
  long *plVar5;
  longlong lVar6;
  QByteArrayView QVar7;
  QByteArray pattern;
  QString local_68;
  QArrayData *local_50 [3];
  QArrayData *local_38;
  
  iVar4 = (**(code **)(*(long *)this->searchDialog + 0x1a8))();
  if (iVar4 != 1) {
    return;
  }
  iVar4 = QTabWidget::currentIndex();
  if (iVar4 == 2) {
    QWidget::setFocus((FocusReason)*(undefined8 *)(this->searchDialog->ui + 0xb8));
    QLineEdit::text();
    if (local_68.d.size != 0) {
      cVar1 = QAbstractButton::isChecked();
      bVar2 = 1;
      if (cVar1 == '\0') {
        bVar2 = QAbstractButton::isChecked();
        bVar2 = bVar2 ^ 3;
      }
      this_00 = this->ffsFinder;
      unicode = (bool)QAbstractButton::isChecked();
      bVar3 = QAbstractButton::isChecked();
      FfsFinder::findTextPattern(this_00,&local_68,bVar2,unicode,(uint)bVar3);
      showFinderMessages(this);
    }
    if (&(local_68.d.d)->super_QArrayData == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0) {
      return;
    }
    lVar6 = 2;
  }
  else {
    if (iVar4 == 1) {
      QWidget::setFocus((FocusReason)*(undefined8 *)(this->searchDialog->ui + 0x70));
      QLineEdit::setCursorPosition((int)*(undefined8 *)(this->searchDialog->ui + 0x70));
      QLineEdit::text();
      QString::toLatin1_helper_inplace((QString *)&local_68);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,8);
        }
      }
      if (local_68.d.size != 0) {
        cVar1 = QAbstractButton::isChecked();
        bVar2 = 1;
        if (cVar1 == '\0') {
          bVar2 = QAbstractButton::isChecked();
          bVar2 = bVar2 ^ 3;
        }
        FfsFinder::findGuidPattern(this->ffsFinder,(QByteArray *)&local_68,bVar2);
        showFinderMessages(this);
      }
    }
    else {
      if (iVar4 != 0) {
        return;
      }
      QWidget::setFocus((FocusReason)*(undefined8 *)(this->searchDialog->ui + 0x28));
      QLineEdit::text();
      QString::toLatin1_helper_inplace((QString *)local_50);
      QVar7.m_data = (storage_type *)0x1;
      QVar7.m_size = (qsizetype)local_50;
      plVar5 = (long *)QByteArray::replace(QVar7,(QByteArrayView)ZEXT816(0x1d41f7));
      local_68.d.d = (Data *)*plVar5;
      local_68.d.ptr = (char16_t *)plVar5[1];
      local_68.d.size = plVar5[2];
      if ((QArrayData *)local_68.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_68.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_68.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],1,8);
        }
      }
      if (local_38 != (QArrayData *)0x0) {
        LOCK();
        (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_38,2,8);
        }
      }
      if (local_68.d.size != 0) {
        cVar1 = QAbstractButton::isChecked();
        bVar2 = 1;
        if (cVar1 == '\0') {
          bVar2 = QAbstractButton::isChecked();
          bVar2 = bVar2 ^ 3;
        }
        FfsFinder::findHexPattern(this->ffsFinder,(QByteArray *)&local_68,bVar2);
        showFinderMessages(this);
      }
    }
    if (&(local_68.d.d)->super_QArrayData == (QArrayData *)0x0) {
      return;
    }
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0) {
      return;
    }
    lVar6 = 1;
  }
  QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,lVar6,8);
  return;
}

Assistant:

void UEFITool::search()
{
    if (searchDialog->exec() != QDialog::Accepted)
        return;
    
    int index = searchDialog->ui->tabWidget->currentIndex();
    if (index == 0) { // Hex pattern
        searchDialog->ui->hexEdit->setFocus();
        QByteArray pattern = searchDialog->ui->hexEdit->text().toLatin1().replace(" ", "");
        if (pattern.isEmpty())
            return;
        UINT8 mode;
        if (searchDialog->ui->hexScopeHeaderRadioButton->isChecked())
            mode = SEARCH_MODE_HEADER;
        else if (searchDialog->ui->hexScopeBodyRadioButton->isChecked())
            mode = SEARCH_MODE_BODY;
        else
            mode = SEARCH_MODE_ALL;
        ffsFinder->findHexPattern(pattern, mode);
        showFinderMessages();
    }
    else if (index == 1) { // GUID
        searchDialog->ui->guidEdit->setFocus();
        searchDialog->ui->guidEdit->setCursorPosition(0);
        QByteArray pattern = searchDialog->ui->guidEdit->text().toLatin1();
        if (pattern.isEmpty())
            return;
        UINT8 mode;
        if (searchDialog->ui->guidScopeHeaderRadioButton->isChecked())
            mode = SEARCH_MODE_HEADER;
        else if (searchDialog->ui->guidScopeBodyRadioButton->isChecked())
            mode = SEARCH_MODE_BODY;
        else
            mode = SEARCH_MODE_ALL;
        ffsFinder->findGuidPattern(pattern, mode);
        showFinderMessages();
    }
    else if (index == 2) { // Text string
        searchDialog->ui->textEdit->setFocus();
        QString pattern = searchDialog->ui->textEdit->text();
        if (pattern.isEmpty())
            return;
        UINT8 mode;
        if (searchDialog->ui->textScopeHeaderRadioButton->isChecked())
            mode = SEARCH_MODE_HEADER;
        else if (searchDialog->ui->textScopeBodyRadioButton->isChecked())
            mode = SEARCH_MODE_BODY;
        else
            mode = SEARCH_MODE_ALL;
        ffsFinder->findTextPattern(pattern, mode, searchDialog->ui->textUnicodeCheckBox->isChecked(),
                                   (Qt::CaseSensitivity) searchDialog->ui->textCaseSensitiveCheckBox->isChecked());
        showFinderMessages();
    }
}